

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

char * quicly_hexdump(uint8_t *bytes,size_t len,size_t indent)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char *__size;
  ulong uVar6;
  char cVar7;
  char cVar8;
  uint8_t uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  char *__s;
  
  if (indent == 0xffffffffffffffff) {
    __size = (char *)(len * 2 + 1);
    pcVar3 = (char *)malloc((size_t)__size);
    if (pcVar3 == (char *)0x0) {
      return (char *)0x0;
    }
    __s = pcVar3;
    if (len != 0) {
      sVar11 = 0;
      do {
        bVar1 = bytes[sVar11];
        *__s = "0123456789abcdef"[bVar1 >> 4];
        __s[1] = "0123456789abcdef"[bVar1 & 0xf];
        __s = __s + 2;
        sVar11 = sVar11 + 1;
      } while (len != sVar11);
    }
  }
  else {
    __size = (char *)((len + 0xf >> 4) * (indent + 0x48) + 1);
    pcVar3 = (char *)malloc((size_t)__size);
    if (pcVar3 == (char *)0x0) {
      return (char *)0x0;
    }
    __s = pcVar3;
    if (len != 0) {
      uVar12 = 0;
      uVar6 = 0;
      do {
        pcVar4 = __s;
        if (indent != 0) {
          memset(__s,0x20,indent);
          pcVar4 = __s + indent;
        }
        *pcVar4 = "0123456789abcdef"[(uint)(uVar6 >> 8) & 0xf];
        pcVar4[1] = "0123456789abcdef"[(uint)(uVar6 >> 4) & 0xf];
        pcVar4[2] = "0123456789abcdef"[(uint)uVar6 & 0xf];
        pcVar4[3] = '0';
        pcVar4[4] = ' ';
        lVar5 = 0;
        pcVar2 = __s + indent + 0xb;
        uVar10 = uVar12;
        do {
          __s = pcVar2;
          cVar7 = ' ';
          if (lVar5 == 0x18) {
            cVar7 = '-';
          }
          pcVar4[lVar5 + 5] = cVar7;
          cVar7 = ' ';
          cVar8 = ' ';
          if (uVar10 < len) {
            cVar7 = "0123456789abcdef"[bytes[uVar10] >> 4];
            cVar8 = "0123456789abcdef"[bytes[uVar10] & 0xf];
          }
          pcVar4[lVar5 + 6] = cVar7;
          pcVar4[lVar5 + 7] = cVar8;
          lVar5 = lVar5 + 3;
          uVar10 = uVar10 + 1;
          pcVar2 = __s + 3;
        } while (lVar5 != 0x30);
        pcVar4[0x35] = ' ';
        pcVar4[0x36] = ' ';
        lVar5 = 0x10;
        uVar10 = uVar12;
        do {
          pcVar4 = __s;
          uVar9 = ' ';
          if ((uVar10 < len) && (uVar9 = bytes[uVar10], 0x5e < (byte)(uVar9 - 0x20))) {
            uVar9 = '.';
          }
          pcVar4[-1] = uVar9;
          __s = pcVar4 + 1;
          uVar10 = uVar10 + 1;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
        *pcVar4 = '\n';
        uVar6 = uVar6 + 1;
        uVar12 = uVar12 + 0x10;
      } while (uVar6 * 0x10 < len);
    }
  }
  *__s = '\0';
  if (__size < __s + (1 - (long)pcVar3)) {
    __assert_fail("p - buf <= bufsize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x17a6,"char *quicly_hexdump(const uint8_t *, size_t, size_t)");
  }
  return pcVar3;
}

Assistant:

char *quicly_hexdump(const uint8_t *bytes, size_t len, size_t indent)
{
    size_t i, line, row, bufsize = indent == SIZE_MAX ? len * 2 + 1 : (indent + 5 + 3 * 16 + 2 + 16 + 1) * ((len + 15) / 16) + 1;
    char *buf, *p;

    if ((buf = malloc(bufsize)) == NULL)
        return NULL;
    p = buf;
    if (indent == SIZE_MAX) {
        for (i = 0; i != len; ++i) {
            quicly_byte_to_hex(p, bytes[i]);
            p += 2;
        }
    } else {
        for (line = 0; line * 16 < len; ++line) {
            for (i = 0; i < indent; ++i)
                *p++ = ' ';
            quicly_byte_to_hex(p, (line >> 4) & 0xff);
            p += 2;
            quicly_byte_to_hex(p, (line << 4) & 0xff);
            p += 2;
            *p++ = ' ';
            for (row = 0; row < 16; ++row) {
                *p++ = row == 8 ? '-' : ' ';
                if (line * 16 + row < len) {
                    quicly_byte_to_hex(p, bytes[line * 16 + row]);
                    p += 2;
                } else {
                    *p++ = ' ';
                    *p++ = ' ';
                }
            }
            *p++ = ' ';
            *p++ = ' ';
            for (row = 0; row < 16; ++row) {
                if (line * 16 + row < len) {
                    int ch = bytes[line * 16 + row];
                    *p++ = 0x20 <= ch && ch < 0x7f ? ch : '.';
                } else {
                    *p++ = ' ';
                }
            }
            *p++ = '\n';
        }
    }
    *p++ = '\0';

    assert(p - buf <= bufsize);

    return buf;
}